

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  element_type *peVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  uchar byte;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  ostream *poVar8;
  uintmax_t uVar9;
  uintmax_t *puVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  long *plVar13;
  long lVar14;
  long *plVar15;
  _Elt_pointer pdVar16;
  int iVar17;
  _Base_ptr p_Var18;
  recursive_directory_iterator dir_1;
  string dir;
  path inputDir;
  FileInfos files;
  string filepath;
  ofstream output;
  int local_4fc;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  recursive_directory_iterator local_4d8;
  undefined1 local_4c8 [24];
  directory_iterator *local_4b0;
  _Elt_pointer local_4a8;
  directory_iterator local_4a0;
  path local_490;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  local_470;
  char **local_440;
  key_type local_438;
  byte abStack_418 [488];
  long *local_230;
  filebuf local_228 [8];
  long local_220 [29];
  ios_base local_138 [264];
  
  local_470._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_470._M_impl.super__Rb_tree_header._M_header;
  local_470._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_470._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_470._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_470._M_impl.super__Rb_tree_header._M_header._M_right =
       local_470._M_impl.super__Rb_tree_header._M_header._M_left;
  if (argc < 3) {
    puts("USAGE: resourcer <directory> <outputfile>");
    exit(-1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,argv[1],(allocator<char> *)&local_438);
  if (local_4a8 == (_Elt_pointer)0x0) {
    pdVar16 = (_Elt_pointer)0x0;
  }
  else {
    cVar2 = ((undefined1 *)
            ((long)&local_4b0[-1]._impl.
                    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 7))[(long)local_4a8];
    pdVar16 = local_4a8;
    if ((cVar2 != '/') && (cVar2 != '\\')) {
      std::__cxx11::string::append((char *)&local_4b0);
      pdVar16 = local_4a8;
    }
  }
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_438,local_4b0,
             (long)&(local_4b0->_impl).
                    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr +
             (long)&(pdVar16->_impl).
                    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
  if ((((local_438._M_string_length < 3) || (*local_438._M_dataplus._M_p != '/')) ||
      (local_438._M_dataplus._M_p[1] != '/')) || (local_438._M_dataplus._M_p[2] == '/')) {
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (local_438._M_dataplus._M_p,
                       local_438._M_dataplus._M_p + local_438._M_string_length);
  }
  else {
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (local_438._M_dataplus._M_p + 2,
                       local_438._M_dataplus._M_p + local_438._M_string_length);
  }
  local_438._M_string_length = (size_type)(_Var7._M_current + -(long)local_438._M_dataplus._M_p);
  *_Var7._M_current = '\0';
  ghc::filesystem::canonical(&local_490,(path *)&local_438);
  local_440 = argv;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"Reading content of \'",0x14);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,local_490._path._M_dataplus._M_p,
             local_490._path._M_dataplus._M_p +
             (long)(shared_ptr<ghc::filesystem::directory_iterator::impl> *)
                   local_490._path._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_438._M_dataplus._M_p,local_438._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' ...",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator(&local_4d8,&local_490)
  ;
  local_4c8._16_8_ = 0;
  local_4fc = 0;
  while( true ) {
    ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)&local_438);
    pdVar16 = ((local_4d8._impl.
                super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_dir_iter_stack).c.
              super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pdVar16 ==
        ((local_4d8._impl.
          super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_dir_iter_stack).c.
        super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pdVar16 = ((local_4d8._impl.
                  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_dir_iter_stack).c.
                super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    lVar14 = *(long *)(local_438._M_dataplus._M_p + 0x38);
    if (lVar14 == *(long *)(local_438._M_dataplus._M_p + 0x40)) {
      lVar14 = *(long *)(*(long *)(local_438._M_dataplus._M_p + 0x50) + -8) + 0x200;
    }
    iVar6 = ghc::filesystem::path::compare
                      (&((pdVar16[-1]._impl.
                          super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_dir_entry)._path,(path *)(*(long *)(lVar14 + -0x10) + 0x38));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length);
    }
    if (iVar6 == 0) break;
    pdVar16 = ((local_4d8._impl.
                super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_dir_iter_stack).c.
              super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pdVar16 ==
        ((local_4d8._impl.
          super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_dir_iter_stack).c.
        super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pdVar16 = ((local_4d8._impl.
                  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_dir_iter_stack).c.
                super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = pdVar16[-1]._impl.
             super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    _Var4._M_p = (peVar3->_dir_entry)._path._path._M_dataplus._M_p;
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,_Var4._M_p,
               _Var4._M_p + (peVar3->_dir_entry)._path._path._M_string_length);
    local_4f8 = &local_4e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f8,local_490._path._M_dataplus._M_p,
               local_490._path._M_dataplus._M_p +
               (long)(shared_ptr<ghc::filesystem::directory_iterator::impl> *)
                     local_490._path._M_string_length);
    std::__cxx11::string::substr((ulong)&local_438,(ulong)&local_230);
    if (local_4f8 != &local_4e8) {
      operator_delete(local_4f8,local_4e8 + 1);
    }
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (*local_438._M_dataplus._M_p != '.')) {
      pdVar16 = ((local_4d8._impl.
                  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_dir_iter_stack).c.
                super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pdVar16 ==
          ((local_4d8._impl.
            super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_dir_iter_stack).c.
          super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pdVar16 = ((local_4d8._impl.
                    super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_dir_iter_stack).c.
                  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      ghc::filesystem::status
                ((filesystem *)&local_230,
                 &((pdVar16[-1]._impl.
                    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_dir_entry)._path);
      if ((int)local_230 == 2) {
        pdVar16 = ((local_4d8._impl.
                    super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_dir_iter_stack).c.
                  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pdVar16 ==
            ((local_4d8._impl.
              super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_dir_iter_stack).c.
            super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pdVar16 = ((local_4d8._impl.
                      super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_dir_iter_stack).c.
                    super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar9 = ghc::filesystem::file_size
                          (&((pdVar16[-1]._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_438._M_dataplus._M_p,
                            local_438._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        puVar10 = (uintmax_t *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)&local_470,&local_438);
        *puVar10 = uVar9;
        local_4fc = local_4fc + (int)uVar9;
        local_4c8._16_8_ = ZEXT48((uint)((int)local_4c8._16_8_ + (int)local_438._M_string_length));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    ghc::filesystem::recursive_directory_iterator::operator++(&local_4d8);
  }
  if (local_4d8._impl.
      super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d8._impl.
               super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Found ",6);
  p_Var1 = &local_470._M_impl.super__Rb_tree_header;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," files with ",0xc);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_4fc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes of data, processing...",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ofstream::ofstream(&local_230,local_440[2],_S_trunc);
  iVar6 = (int)local_470._M_impl.super__Rb_tree_header._M_node_count;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"const int g_resourceDataSize = ",0x1f);
  iVar6 = (int)local_4c8._16_8_ + local_4fc + iVar6 * 0xc + 5;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"const unsigned char g_resourceData[",0x23);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = {",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  writeInt((ostream *)&local_230,(int)local_470._M_impl.super__Rb_tree_header._M_node_count);
  iVar6 = (int)local_470._M_impl.super__Rb_tree_header._M_node_count * 4 + 4;
  if ((_Rb_tree_header *)local_470._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var11 = local_470._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      writeInt((ostream *)&local_230,iVar6);
      iVar6 = iVar6 + p_Var11[2]._M_color + *(int *)&p_Var11[1]._M_parent + 8;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    iVar6 = (int)local_470._M_impl.super__Rb_tree_header._M_node_count * 4 + 4;
  }
  if ((_Rb_tree_header *)local_470._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var11 = local_470._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"packing \'",9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' ...",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (globalCount != iVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"    error: expected offset ",0x1b);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," current offset ",0x10);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,globalCount);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," !!!",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      writeInt((ostream *)&local_230,p_Var11[2]._M_color);
      writeInt((ostream *)&local_230,*(int *)&p_Var11[1]._M_parent);
      if (p_Var11[1]._M_parent != (_Base_ptr)0x0) {
        p_Var12 = (_Base_ptr)0x0;
        p_Var18 = (_Base_ptr)0x1;
        do {
          writeByte((ostream *)&local_230,
                    *(uchar *)((long)&p_Var12->_M_color + *(long *)(p_Var11 + 1)));
          bVar5 = p_Var18 < p_Var11[1]._M_parent;
          p_Var12 = p_Var18;
          p_Var18 = (_Base_ptr)(ulong)((int)p_Var18 + 1);
        } while (bVar5);
      }
      local_4d8._impl.
      super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_4c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,local_4b0,
                 (long)&(local_4b0->_impl).
                        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr +
                 (long)&(local_4a8->_impl).
                        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
      plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_4d8,*(ulong *)(p_Var11 + 1));
      local_4f8 = &local_4e8;
      plVar15 = plVar13 + 2;
      if ((long *)*plVar13 == plVar15) {
        local_4e8 = *plVar15;
        lStack_4e0 = plVar13[3];
      }
      else {
        local_4e8 = *plVar15;
        local_4f8 = (long *)*plVar13;
      }
      local_4f0 = plVar13[1];
      *plVar13 = (long)plVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::ifstream::ifstream(&local_438,(char *)local_4f8,_S_bin);
      if (local_4f8 != &local_4e8) {
        operator_delete(local_4f8,local_4e8 + 1);
      }
      if (local_4d8._impl.
          super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)local_4c8) {
        operator_delete(local_4d8._impl.
                        super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_4c8._0_8_ + 1);
      }
      iVar17 = 0;
      if ((abStack_418[*(long *)(local_438._M_dataplus._M_p + -0x18)] & 2) == 0) {
        iVar17 = 0;
        do {
          byte = std::istream::get();
          if ((abStack_418[*(long *)(local_438._M_dataplus._M_p + -0x18)] & 2) != 0) break;
          writeByte((ostream *)&local_230,byte);
          iVar17 = iVar17 + 1;
        } while ((abStack_418[*(long *)(local_438._M_dataplus._M_p + -0x18)] & 2) == 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," imported ",10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," with ",6);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = iVar6 + p_Var11[2]._M_color + *(int *)&p_Var11[1]._M_parent + 8;
      std::ifstream::~ifstream(&local_438);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != &local_470._M_impl.super__Rb_tree_header);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,lineBuffer_abi_cxx11_._M_dataplus._M_p,
                      lineBuffer_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"0",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"};",2);
  std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::ofstream::close();
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,globalCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," / ",3);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes done.",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + _VTT[-3] + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._path._M_dataplus._M_p != &local_490._path.field_2) {
    operator_delete(local_490._path._M_dataplus._M_p,
                    local_490._path.field_2._M_allocated_capacity + 1);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0,
                    (ulong)((long)&((local_4a0._impl.
                                     super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_base)._path._M_dataplus._M_p + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&local_470);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    FileInfos files;
    int totalSize = 0;
    int filenamesSize = 0;
    if (argc < 3) {
        puts("USAGE: resourcer <directory> <outputfile>");
        exit(-1);
    }

    std::string dir = argv[1];
    if (!dir.empty() && dir[dir.length() - 1] != '/' && dir[dir.length() - 1] != '\\') {
        dir += "/";
    }

    fs::path inputDir = fs::canonical(dir);
    std::clog << "Reading content of '" << inputDir.string() << "' ..." << std::endl;

    for (fs::recursive_directory_iterator dir(inputDir); dir != fs::recursive_directory_iterator(); ++dir) {
        std::string filepath = dir->path().string().substr(inputDir.string().length() + 1);
        if (!filepath.empty() && filepath[0] != '.' && fs::is_regular_file(*dir)) {
            long size = (long)fs::file_size(*dir);
            std::cout << filepath << " (" << size << ")" << std::endl;
            files[filepath] = size;
            totalSize += size;
            filenamesSize += filepath.length();
        }
    }

    std::clog << "Found " << files.size() << " files with " << totalSize << " bytes of data, processing..." << std::endl;

    std::ofstream output(argv[2], std::ios::trunc);
    int resourceDataSize = (totalSize + 4 + files.size() * 12 + filenamesSize + 1);
    output << "const int g_resourceDataSize = " << resourceDataSize << ";" << std::endl;
    output << "const unsigned char g_resourceData[" << resourceDataSize << "] = {" << std::endl;
    writeInt(output, files.size());
    int offset = 4 + files.size() * 4;
    for (FileInfos::const_iterator iter = files.begin(); iter != files.end(); ++iter) {
        writeInt(output, offset);
        offset += iter->second + 8 + iter->first.length();
    }
    int checkByteNum = 0;
    offset = 4 + files.size() * 4;
    for (FileInfos::const_iterator iter = files.begin(); iter != files.end(); ++iter) {
        std::clog << "packing '" << iter->first << "' ..." << std::endl;
        if (globalCount != offset) {
            std::clog << "    error: expected offset " << offset << " current offset " << globalCount << " !!!" << std::endl;
        }
        writeInt(output, iter->second);
        writeInt(output, iter->first.length());
        writeString(output, iter->first);
        std::ifstream file((std::string(dir) + iter->first).c_str(), std::ios::binary);
        int c;
        while (!file.eof()) {
            c = file.get();
            if (!file.eof()) {
                writeByte(output, (unsigned char)c);
                ++checkByteNum;
            }
        }
        std::clog << " imported " << iter->first << " with " << checkByteNum << " bytes" << std::endl;
        offset += iter->second + 8 + iter->first.length();
        checkByteNum = 0;
    }
    output << lineBuffer << "0" << std::endl;
    output << "};" << std::endl;
    output.close();
    std::clog << globalCount << " / " << offset << " bytes done." << std::endl;
    return 0;
}